

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedHelpers.cpp
# Opt level: O1

void __thiscall RGBValue::ConvertToControllerOrder(RGBValue *this,ColorLayout layout,U16 *values)

{
  RGBValue *pRVar1;
  
  if (layout == LAYOUT_RGB) {
    *values = this->red;
    pRVar1 = (RGBValue *)&this->green;
  }
  else {
    if (layout != LAYOUT_GRB) {
      return;
    }
    *values = this->green;
    pRVar1 = this;
  }
  values[1] = pRVar1->red;
  values[2] = this->blue;
  return;
}

Assistant:

void RGBValue::ConvertToControllerOrder( ColorLayout layout, U16* values ) const
{
    switch( layout )
    {
    case LAYOUT_GRB:
        values[ 0 ] = green;
        values[ 1 ] = red;
        values[ 2 ] = blue;
        break;

    case LAYOUT_RGB:
        values[ 0 ] = red;
        values[ 1 ] = green;
        values[ 2 ] = blue;
        break;
    }
}